

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

LimitToken __thiscall
google::protobuf::internal::EpsCopyInputStream::PushLimit
          (EpsCopyInputStream *this,char *ptr,int limit)

{
  int iVar1;
  uint in_ECX;
  uint uVar2;
  LogMessageFatal LStack_18;
  
  if (in_ECX < 0x7ffffff0) {
    uVar2 = (limit - (int)*(long *)(ptr + 8)) + in_ECX;
    *(long *)ptr = (long)(int)((int)uVar2 >> 0x1f & uVar2) + *(long *)(ptr + 8);
    iVar1 = *(int *)(ptr + 0x1c);
    *(uint *)(ptr + 0x1c) = uVar2;
    *(uint *)&this->limit_end_ = iVar1 - uVar2;
    return (LimitToken)(int)this;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
             ,0x9e,"limit >= 0 && limit <= INT_MAX - kSlopBytes");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

[[nodiscard]] LimitToken PushLimit(const char* ptr, int limit) {
    ABSL_DCHECK(limit >= 0 && limit <= INT_MAX - kSlopBytes);
    // This add is safe due to the invariant above, because
    // ptr - buffer_end_ <= kSlopBytes.
    limit += static_cast<int>(ptr - buffer_end_);
    limit_end_ = buffer_end_ + (std::min)(0, limit);
    auto old_limit = limit_;
    limit_ = limit;
    return LimitToken(old_limit - limit);
  }